

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::FileCryptoMetaData::printTo(FileCryptoMetaData *this,ostream *out)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_40;
  
  std::operator<<(out,"FileCryptoMetaData(");
  poVar1 = std::operator<<(out,"encryption_algorithm=");
  duckdb_apache::thrift::to_string<duckdb_parquet::EncryptionAlgorithm>
            (&local_40,&this->encryption_algorithm);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"key_metadata=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<std::__cxx11::string>
              (&local_40,(thrift *)&this->key_metadata,t);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void FileCryptoMetaData::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "FileCryptoMetaData(";
  out << "encryption_algorithm=" << to_string(encryption_algorithm);
  out << ", " << "key_metadata="; (__isset.key_metadata ? (out << to_string(key_metadata)) : (out << "<null>"));
  out << ")";
}